

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O1

string * __thiscall
smf::MidiMessage::getMetaContent_abi_cxx11_(string *__return_storage_ptr__,MidiMessage *this)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((puVar2 != puVar1) && (2 < (ulong)((long)puVar2 - (long)puVar1))) && (*puVar1 == 0xff)) {
    uVar3 = 3;
    if ((((char)puVar1[2] < '\0') && (uVar3 = 4, (char)puVar1[3] < '\0')) &&
       (uVar3 = 5, (char)puVar1[4] < '\0')) {
      uVar3 = puVar1[5] >> 7 | 6;
    }
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    if ((int)uVar3 <
        *(int *)&(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
        (int)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start) {
      do {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar3 = uVar3 + 1;
      } while ((int)uVar3 <
               *(int *)&(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
               (int)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MidiMessage::getMetaContent(void) const {
	std::string output;
	if (!isMetaMessage()) {
		return output;
	}
	int start = 3;
	if (operator[](2) > 0x7f) {
		start++;
		if (operator[](3) > 0x7f) {
			start++;
			if (operator[](4) > 0x7f) {
				start++;
				if (operator[](5) > 0x7f) {
					start++;
					// maximum of 5 bytes in VLV, so last must be < 0x80
				}
			}
		}
	}
	output.reserve(this->size());
	for (int i=start; i<(int)this->size(); i++) {
		output.push_back(operator[](i));
	}
	return output;
}